

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_include.c
# Opt level: O2

void emulate_arith3i(int code,reg_type *dest,reg_type *src1,long imm)

{
  uint uVar1;
  anon_union_8_11_4e3cf189_for_u aVar2;
  byte bVar3;
  int iVar4;
  
  bVar3 = (byte)imm;
  uVar1 = (uint)imm;
  switch(code) {
  case 0:
  case 1:
    uVar1 = uVar1 + (src1->u).i.i;
    goto LAB_00112c11;
  case 2:
  case 3:
  case 0x28:
    aVar2 = (anon_union_8_11_4e3cf189_for_u)(imm + (long)src1->u);
    goto LAB_00112c20;
  case 4:
  case 5:
    uVar1 = (src1->u).i.i - uVar1;
    goto LAB_00112c89;
  case 6:
  case 7:
  case 0x29:
    aVar2 = (anon_union_8_11_4e3cf189_for_u)((long)src1->u - imm);
    break;
  case 8:
  case 9:
    uVar1 = uVar1 * *(int *)&src1->u;
    goto LAB_00112c11;
  case 10:
  case 0xb:
    aVar2 = (anon_union_8_11_4e3cf189_for_u)(imm * (long)src1->u);
    goto LAB_00112c20;
  case 0xc:
    uVar1 = *(int *)&src1->u / (int)uVar1;
    goto LAB_00112c89;
  case 0xd:
    uVar1 = (uint)((ulong)(uint)(src1->u).i.i / (imm & 0xffffffffU));
    goto LAB_00112c89;
  case 0xe:
    aVar2 = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u / (ulong)imm);
    break;
  case 0xf:
    aVar2 = (anon_union_8_11_4e3cf189_for_u)((long)src1->u / imm);
    break;
  case 0x10:
    iVar4 = *(int *)&src1->u % (int)uVar1;
    goto LAB_00112c82;
  case 0x11:
    iVar4 = (int)((ulong)(uint)(src1->u).i.i % (imm & 0xffffffffU));
LAB_00112c82:
    (dest->u).i.i = iVar4;
    return;
  case 0x12:
    aVar2 = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u % (ulong)imm);
    goto LAB_00112c6b;
  case 0x13:
    aVar2 = (anon_union_8_11_4e3cf189_for_u)((long)src1->u % imm);
LAB_00112c6b:
    dest->u = aVar2;
    return;
  case 0x14:
  case 0x15:
    uVar1 = uVar1 ^ (src1->u).i.i;
    goto LAB_00112c11;
  case 0x16:
  case 0x17:
    aVar2 = (anon_union_8_11_4e3cf189_for_u)(imm ^ (ulong)src1->u);
    goto LAB_00112c20;
  case 0x18:
  case 0x19:
    uVar1 = uVar1 & (src1->u).i.i;
    goto LAB_00112c11;
  case 0x1a:
  case 0x1b:
    aVar2 = (anon_union_8_11_4e3cf189_for_u)(imm & (ulong)src1->u);
    goto LAB_00112c20;
  case 0x1c:
  case 0x1d:
    uVar1 = uVar1 | (src1->u).i.i;
LAB_00112c11:
    (dest->u).i.i = uVar1;
    return;
  case 0x1e:
  case 0x1f:
    aVar2 = (anon_union_8_11_4e3cf189_for_u)(imm | (ulong)src1->u);
LAB_00112c20:
    dest->u = aVar2;
    return;
  case 0x20:
  case 0x21:
    uVar1 = (src1->u).i.i << (bVar3 & 0x1f);
    goto LAB_00112c89;
  case 0x22:
  case 0x23:
    aVar2 = (anon_union_8_11_4e3cf189_for_u)((long)src1->u << (bVar3 & 0x3f));
    break;
  case 0x24:
    uVar1 = (src1->u).i.i >> (bVar3 & 0x1f);
    goto LAB_00112c89;
  case 0x25:
    uVar1 = (uint)(src1->u).i.i >> (bVar3 & 0x1f);
LAB_00112c89:
    (dest->u).i.i = uVar1;
    return;
  case 0x26:
    aVar2 = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u >> (bVar3 & 0x3f));
    break;
  case 0x27:
    aVar2 = (anon_union_8_11_4e3cf189_for_u)((long)src1->u >> (bVar3 & 0x3f));
    break;
  default:
    goto switchD_00112bd1_default;
  }
  dest->u = aVar2;
switchD_00112bd1_default:
  return;
}

Assistant:

void emulate_arith3i(int code, struct reg_type *dest, struct reg_type *src1, IMM_TYPE imm)
{
    switch(code) {
	  case dill_jmp_addi:  dest->u.i.i =  src1->u.i.i + (int) imm; break;
	  case dill_jmp_addu:  dest->u.u.u =  src1->u.u.u + (unsigned int) imm; break;
	  case dill_jmp_addul:  dest->u.ul.ul =  src1->u.ul.ul +  imm; break;
	  case dill_jmp_addl:  dest->u.l.l =  src1->u.l.l +  imm; break;
	  case dill_jmp_addp:  dest->u.p.p = (char*) src1->u.p.p +  imm; break;
	  case dill_jmp_subi:  dest->u.i.i =  src1->u.i.i - (int) imm; break;
	  case dill_jmp_subu:  dest->u.u.u =  src1->u.u.u - (unsigned int) imm; break;
	  case dill_jmp_subul:  dest->u.ul.ul =  src1->u.ul.ul -  imm; break;
	  case dill_jmp_subl:  dest->u.l.l =  src1->u.l.l -  imm; break;
	  case dill_jmp_subp:  dest->u.p.p = (char*) src1->u.p.p -  imm; break;
	  case dill_jmp_mulu:  dest->u.u.u =  src1->u.u.u * (unsigned int) imm; break;
	  case dill_jmp_mulul:  dest->u.ul.ul =  src1->u.ul.ul *  imm; break;
	  case dill_jmp_muli:  dest->u.i.i =  src1->u.i.i * (int) imm; break;
	  case dill_jmp_mull:  dest->u.l.l =  src1->u.l.l *  imm; break;
	  case dill_jmp_divu:  dest->u.u.u =  src1->u.u.u / (unsigned int) imm; break;
	  case dill_jmp_divul:  dest->u.ul.ul =  src1->u.ul.ul /  imm; break;
	  case dill_jmp_divi:  dest->u.i.i =  src1->u.i.i / (int) imm; break;
	  case dill_jmp_divl:  dest->u.l.l =  src1->u.l.l /  imm; break;
	  case dill_jmp_modu:  dest->u.u.u =  src1->u.u.u % (unsigned int) imm; break;
	  case dill_jmp_modul:  dest->u.ul.ul =  src1->u.ul.ul %  imm; break;
	  case dill_jmp_modi:  dest->u.i.i =  src1->u.i.i % (int) imm; break;
	  case dill_jmp_modl:  dest->u.l.l =  src1->u.l.l %  imm; break;
	  case dill_jmp_andi:  dest->u.i.i =  src1->u.i.i & (int) imm; break;
	  case dill_jmp_andu:  dest->u.u.u =  src1->u.u.u & (unsigned int) imm; break;
	  case dill_jmp_andul:  dest->u.ul.ul =  src1->u.ul.ul &  imm; break;
	  case dill_jmp_andl:  dest->u.l.l =  src1->u.l.l &  imm; break;
	  case dill_jmp_ori:  dest->u.i.i =  src1->u.i.i | (int) imm; break;
	  case dill_jmp_oru:  dest->u.u.u =  src1->u.u.u | (unsigned int) imm; break;
	  case dill_jmp_orul:  dest->u.ul.ul =  src1->u.ul.ul |  imm; break;
	  case dill_jmp_orl:  dest->u.l.l =  src1->u.l.l |  imm; break;
	  case dill_jmp_xori:  dest->u.i.i =  src1->u.i.i ^ (int) imm; break;
	  case dill_jmp_xoru:  dest->u.u.u =  src1->u.u.u ^ (unsigned int) imm; break;
	  case dill_jmp_xorul:  dest->u.ul.ul =  src1->u.ul.ul ^  imm; break;
	  case dill_jmp_xorl:  dest->u.l.l =  src1->u.l.l ^  imm; break;
	  case dill_jmp_lshi:  dest->u.i.i =  src1->u.i.i << (int) imm; break;
	  case dill_jmp_lshu:  dest->u.u.u =  src1->u.u.u << (unsigned int) imm; break;
	  case dill_jmp_lshul:  dest->u.ul.ul =  src1->u.ul.ul <<  imm; break;
	  case dill_jmp_lshl:  dest->u.l.l =  src1->u.l.l <<  imm; break;
	  case dill_jmp_rshi:  dest->u.i.i =  src1->u.i.i >> (int) imm; break;
	  case dill_jmp_rshu:  dest->u.u.u =  src1->u.u.u >> (unsigned int) imm; break;
	  case dill_jmp_rshul:  dest->u.ul.ul =  src1->u.ul.ul >>  imm; break;
	  case dill_jmp_rshl:  dest->u.l.l =  src1->u.l.l >>  imm; break;
    }
}